

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriggerVariableTests.cpp
# Opt level: O0

void __thiscall
triggervariable_waitActivation_Test::~triggervariable_waitActivation_Test
          (triggervariable_waitActivation_Test *this)

{
  triggervariable_waitActivation_Test *this_local;
  
  ~triggervariable_waitActivation_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(triggervariable, waitActivation)
{
    TriggerVariable trigger;
    std::atomic<bool> started{false};
    std::atomic<bool> completed{false};
    auto fut = std::async(std::launch::async, [&]() {
        started = true;
        trigger.waitActivation();
        completed = true;
    });

    std::this_thread::yield();
    while (!started.load()) {
        std::this_thread::yield();
    }
    EXPECT_TRUE(started.load());
    EXPECT_FALSE(completed.load());
    trigger.activate();
    std::this_thread::yield();
    if (!completed.load()) {
        std::this_thread::sleep_for(std::chrono::milliseconds(100));
    }
    EXPECT_TRUE(completed.load());
}